

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SnapshotTextFormatter.cpp
# Opt level: O2

ostream * __thiscall
cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::print
          (SnapshotTextFormatterImpl *this,ostream *os,CaliperMetadataAccessInterface *db,
          vector<cali::Entry,_std::allocator<cali::Entry>_> *list)

{
  mutex *__mutex;
  Node *pNVar1;
  pointer pFVar2;
  pointer pFVar3;
  pthread_mutex_t *__mutex_00;
  bool bVar4;
  int iVar5;
  cali_attr_type cVar6;
  undefined4 extraout_var;
  ostream *poVar7;
  cali_id_t cVar8;
  string *psVar9;
  char cVar10;
  lock_guard<std::mutex> g;
  pointer pFVar11;
  char *pcVar12;
  pointer this_00;
  Node *pNVar13;
  vector<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,_std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>_>
  local_c8;
  string str;
  Variant local_88;
  pthread_mutex_t *local_70;
  SnapshotTextFormatterImpl *local_68;
  CaliperMetadataAccessInterface *local_60;
  pointer local_58;
  string local_50;
  
  local_c8.
  super__Vector_base<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,_std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.
  super__Vector_base<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,_std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.
  super__Vector_base<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,_std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __mutex = &this->m_field_mutex;
  local_60 = db;
  std::mutex::lock(__mutex);
  local_68 = this;
  std::
  vector<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>>
  ::
  _M_assign_aux<__gnu_cxx::__normal_iterator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field*,std::vector<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>>>>
            ((vector<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>>
              *)&local_c8,
             (this->m_fields).
             super__Vector_base<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,_std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->m_fields).
             super__Vector_base<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,_std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  local_70 = (pthread_mutex_t *)__mutex;
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  local_58 = local_c8.
             super__Vector_base<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,_std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  bVar4 = false;
  pFVar11 = local_c8.
            super__Vector_base<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,_std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>_>
            ._M_impl.super__Vector_impl_data._M_start;
  do {
    __mutex_00 = local_70;
    if (pFVar11 == local_58) {
      if (bVar4) {
        std::mutex::lock((mutex *)&local_70->__data);
        pFVar11 = (local_68->m_fields).
                  super__Vector_base<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,_std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
        (local_68->m_fields).
        super__Vector_base<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,_std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             local_c8.
             super__Vector_base<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,_std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        pFVar2 = (local_68->m_fields).
                 super__Vector_base<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,_std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pFVar3 = (local_68->m_fields).
                 super__Vector_base<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,_std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        (local_68->m_fields).
        super__Vector_base<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,_std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>_>
        ._M_impl.super__Vector_impl_data._M_start =
             local_c8.
             super__Vector_base<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,_std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>_>
             ._M_impl.super__Vector_impl_data._M_start;
        (local_68->m_fields).
        super__Vector_base<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,_std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_c8.
             super__Vector_base<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,_std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_c8.
        super__Vector_base<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,_std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>_>
        ._M_impl.super__Vector_impl_data._M_start = pFVar2;
        local_c8.
        super__Vector_base<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,_std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>_>
        ._M_impl.super__Vector_impl_data._M_finish = pFVar3;
        local_c8.
        super__Vector_base<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,_std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = pFVar11;
        pthread_mutex_unlock(__mutex_00);
      }
      std::
      vector<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,_std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>_>
      ::~vector(&local_c8);
      return os;
    }
    if ((pFVar11->attr_name)._M_string_length != 0) {
      iVar5 = (*local_60->_vptr_CaliperMetadataAccessInterface[2])(local_60,&pFVar11->attr_name);
      (pFVar11->attr).m_node = (Node *)CONCAT44(extraout_var,iVar5);
      (pFVar11->attr_name)._M_string_length = 0;
      *(pFVar11->attr_name)._M_dataplus._M_p = '\0';
      cVar6 = Attribute::type(&pFVar11->attr);
      if (((CALI_TYPE_DOUBLE < cVar6) || (cVar10 = 'r', (0x4cU >> (cVar6 & 0x1f) & 1) == 0)) &&
         (cVar10 = 'l', cVar6 == CALI_TYPE_ADDR)) {
        cVar10 = 'r';
      }
      pFVar11->align = cVar10;
      bVar4 = true;
    }
    str._M_dataplus._M_p = (pointer)&str.field_2;
    str._M_string_length = 0;
    str.field_2._M_local_buf[0] = '\0';
    if ((pFVar11->attr).m_node != (Node *)0x0) {
      for (this_00 = (list->super__Vector_base<cali::Entry,_std::allocator<cali::Entry>_>)._M_impl.
                     super__Vector_impl_data._M_start;
          this_00 !=
          (list->super__Vector_base<cali::Entry,_std::allocator<cali::Entry>_>)._M_impl.
          super__Vector_impl_data._M_finish; this_00 = this_00 + 1) {
        iVar5 = Entry::count(this_00,&pFVar11->attr);
        if (iVar5 != 0) {
          pNVar13 = this_00->m_node;
          if (pNVar13 != (Node *)0x0) {
            if (pNVar13->m_attribute == 8) {
              local_88.m_v.type_and_size = (this_00->m_value).m_v.type_and_size;
              local_88.m_v.value = (this_00->m_value).m_v.value;
              Variant::to_string_abi_cxx11_(&local_50,&local_88);
              std::__cxx11::string::append((string *)&str);
              std::__cxx11::string::~string((string *)&local_50);
            }
            else {
              for (; pNVar13 != (Node *)0x0;
                  pNVar13 = *(Node **)((long)&(((pNVar13->super_LockfreeIntrusiveTree<cali::Node>).
                                               m_me)->super_LockfreeIntrusiveTree<cali::Node>).m_me
                                      + (pNVar13->super_LockfreeIntrusiveTree<cali::Node>).m_node))
              {
                pNVar1 = (pFVar11->attr).m_node;
                cVar8 = 0xffffffffffffffff;
                if (pNVar1 != (Node *)0x0) {
                  cVar8 = pNVar1->m_id;
                }
                if (pNVar13->m_attribute == cVar8) {
                  local_88.m_v.type_and_size = (pNVar13->m_data).m_v.type_and_size;
                  local_88.m_v.value = (pNVar13->m_data).m_v.value;
                  Variant::to_string_abi_cxx11_(&local_50,&local_88);
                  psVar9 = (string *)std::__cxx11::string::append((char *)&local_50);
                  std::__cxx11::string::append(psVar9);
                  std::__cxx11::string::_M_assign((string *)&str);
                  std::__cxx11::string::~string((string *)&local_50);
                }
              }
            }
          }
          break;
        }
      }
    }
    iVar5 = pFVar11->width - (int)str._M_string_length;
    if (0x4f < iVar5) {
      iVar5 = 0x50;
    }
    if (pFVar11->width <= (int)str._M_string_length) {
      iVar5 = 0;
    }
    if (pFVar11->align == 'r') {
      poVar7 = std::operator<<(os,(string *)pFVar11);
      pcVar12 = "                                                                                " +
                (0x50 - iVar5);
      if (iVar5 < 1) {
        pcVar12 = "";
      }
      poVar7 = std::operator<<(poVar7,pcVar12);
      std::operator<<(poVar7,(string *)&str);
    }
    else {
      poVar7 = std::operator<<(os,(string *)pFVar11);
      poVar7 = std::operator<<(poVar7,(string *)&str);
      pcVar12 = "                                                                                " +
                (0x50 - iVar5);
      if (iVar5 < 1) {
        pcVar12 = "";
      }
      std::operator<<(poVar7,pcVar12);
    }
    std::__cxx11::string::~string((string *)&str);
    pFVar11 = pFVar11 + 1;
  } while( true );
}

Assistant:

std::ostream& print(std::ostream& os, const CaliperMetadataAccessInterface& db, const std::vector<Entry>& list)
    {
        std::vector<Field> fields;

        {
            std::lock_guard<std::mutex> g(m_field_mutex);

            fields.assign(m_fields.begin(), m_fields.end());
        }

        bool update = false;

        for (Field& f : fields) {
            if (!f.attr_name.empty()) {
                f.attr = db.get_attribute(f.attr_name);
                f.attr_name.clear();

                cali_attr_type type = f.attr.type();

                f.align = (type == CALI_TYPE_DOUBLE || type == CALI_TYPE_INT || type == CALI_TYPE_UINT
                           || type == CALI_TYPE_ADDR)
                              ? 'r'
                              : 'l';

                update = true;
            }

            std::string str;

            if (f.attr) {
                Entry e;

                for (auto it = list.begin(); it != list.end(); ++it)
                    if ((*it).count(f.attr)) {
                        e = *it;
                        break;
                    }

                if (e.is_reference()) {
                    for (const Node* node = e.node(); node; node = node->parent())
                        if (node->attribute() == f.attr.id())
                            str = node->data().to_string().append(str.size() ? "/" : "").append(str);
                } else if (e.is_immediate()) {
                    str.append(e.value().to_string());
                }
            }

            static const char whitespace[80 + 1] =
                "                                        "
                "                                        ";

            int len = str.size();
            int w   = len < f.width ? std::min<int>(f.width - len, 80) : 0;

            if (f.align == 'r')
                os << f.prefix << (w > 0 ? whitespace + (80 - w) : "") << str;
            else
                os << f.prefix << str << (w > 0 ? whitespace + (80 - w) : "");
        }

        if (update) {
            std::lock_guard<std::mutex> g(m_field_mutex);

            m_fields.swap(fields);
        }

        return os;
    }